

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::EncryptionAlgorithm::EncryptionAlgorithm
          (EncryptionAlgorithm *this,EncryptionAlgorithm *other217)

{
  long in_RSI;
  TBase *in_RDI;
  AesGcmV1 *other214;
  AesGcmV1 *in_stack_ffffffffffffffd0;
  AesGcmCtrV1 *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__EncryptionAlgorithm_00c024c0;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__EncryptionAlgorithm_00c024c0;
  other214 = (AesGcmV1 *)(in_RDI + 1);
  AesGcmV1::AesGcmV1(in_stack_ffffffffffffffd0);
  this_00 = (AesGcmCtrV1 *)(in_RDI + 0xb);
  AesGcmCtrV1::AesGcmCtrV1(this_00);
  _EncryptionAlgorithm__isset::_EncryptionAlgorithm__isset
            ((_EncryptionAlgorithm__isset *)(in_RDI + 0x15));
  AesGcmV1::operator=((AesGcmV1 *)this_00,other214);
  AesGcmCtrV1::operator=(this_00,(AesGcmCtrV1 *)other214);
  *(undefined1 *)&in_RDI[0x15]._vptr_TBase = *(undefined1 *)(in_RSI + 0xa8);
  return;
}

Assistant:

EncryptionAlgorithm::EncryptionAlgorithm(const EncryptionAlgorithm& other217) {
  AES_GCM_V1 = other217.AES_GCM_V1;
  AES_GCM_CTR_V1 = other217.AES_GCM_CTR_V1;
  __isset = other217.__isset;
}